

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void tests::disconnect_edge(void)

{
  pointer ppNVar1;
  NS *pNVar2;
  N *this;
  N *this_00;
  N *this_01;
  N *this_02;
  N *this_03;
  N *this_04;
  initializer_list<N_*> ns;
  initializer_list<N_*> ns_00;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> viewed;
  vector<N_*,_std::allocator<N_*>_> local_98;
  undefined1 local_80 [8];
  _Rb_tree_node_base local_78;
  size_t local_58;
  _Any_data local_50;
  code *local_40;
  
  pNVar2 = (NS *)operator_new(0x18);
  (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this,"p");
  this_00 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_00,"q");
  this_01 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_01,"r");
  this_02 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_02,"x");
  this_03 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_03,"y");
  this_04 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_04,"z");
  local_80 = (undefined1  [8])this_03;
  N::connect(this_02,(int)this,(sockaddr *)local_80,1);
  local_80 = (undefined1  [8])this_03;
  local_78._0_8_ = this_04;
  N::connect(this_02,(int)this_00,(sockaddr *)local_80,2);
  local_80 = (undefined1  [8])this_04;
  N::connect(this_02,(int)this_01,(sockaddr *)local_80,1);
  ns._M_len = 2;
  ns._M_array = (iterator)local_80;
  local_80 = (undefined1  [8])this_03;
  local_78._0_8_ = this_04;
  N::disconnect(this_02,this_00,ns);
  ns_00._M_len = 1;
  ns_00._M_array = (iterator)local_80;
  local_80 = (undefined1  [8])this_04;
  N::disconnect(this_02,this_01,ns_00);
  local_80 = (undefined1  [8])this_04;
  N::connect(this_02,(int)this_00,(sockaddr *)local_80,1);
  local_78._M_left = &local_78;
  local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
  local_78._M_parent = (_Base_ptr)0x0;
  local_58 = 0;
  local_78._M_right = local_78._M_left;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"digraph T {",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  alg::dot((ostream *)&std::cout,(set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)local_80);
  local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  N::histo(this_02,(Alg<void> *)&local_50,&local_98);
  if (local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  pNVar2 = NS::clear(pNVar2);
  if ((pNVar2 != (NS *)0x0) &&
     (ppNVar1 = (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                super__Vector_impl_data._M_start, ppNVar1 != (pointer)0x0)) {
    operator_delete(ppNVar1,(long)(pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar1)
    ;
  }
  operator_delete(pNVar2,0x18);
  std::_Rb_tree<N_*,_N_*,_std::_Identity<N_*>,_std::less<N_*>,_std::allocator<N_*>_>::~_Rb_tree
            ((_Rb_tree<N_*,_N_*,_std::_Identity<N_*>,_std::less<N_*>,_std::allocator<N_*>_> *)
             local_80);
  return;
}

Assistant:

void disconnect_edge() {
        auto g = new NS();
        auto p = new(g) N("p"), q = new(g) N("q"), r = new(g) N("r");
        auto n1 = new(g) N("x"), n2 = new(g) N("y"), n3 = new(g) N("z");

        n1->connect(p, {n2});
        n1->connect(q, {n2, n3});
        n1->connect(r, {n3});

        n1->disconnect(q, {n2, n3});
        n1->disconnect(r, {n3});
        n1->connect(q, {n3});

        std::set<N*> viewed;
        cout << "digraph T {" << endl;
        n1->histo(alg::dot(cout, viewed));
        cout << "}" << endl;

        delete g->clear();
    }